

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_status(int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  int iVar1;
  
  if (9 < (uint)op) {
    sqlite3MisuseError(0x35e5);
    return 0x15;
  }
  iVar1 = sqlite3Stat.nowValue[(uint)op];
  *pCurrent = iVar1;
  *pHighwater = sqlite3Stat.mxValue[(uint)op];
  if (resetFlag != 0) {
    sqlite3Stat.mxValue[(uint)op] = iVar1;
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_status(int op, int *pCurrent, int *pHighwater, int resetFlag){
  wsdStatInit;
  if( op<0 || op>=ArraySize(wsdStat.nowValue) ){
    return SQLITE_MISUSE_BKPT;
  }
  *pCurrent = wsdStat.nowValue[op];
  *pHighwater = wsdStat.mxValue[op];
  if( resetFlag ){
    wsdStat.mxValue[op] = wsdStat.nowValue[op];
  }
  return SQLITE_OK;
}